

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

If * wasm::anon_unknown_18::FunctionSplitter::getIf(Expression *curr,Index i)

{
  If *pIVar1;
  If *pIVar2;
  
  pIVar1 = (If *)getItem(curr,i);
  if (pIVar1 == (If *)0x0) {
    pIVar2 = (If *)0x0;
  }
  else {
    pIVar2 = (If *)0x0;
    if ((pIVar1->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id == IfId) {
      pIVar2 = pIVar1;
    }
  }
  return pIVar2;
}

Assistant:

static If* getIf(Expression* curr, Index i = 0) {
    auto* item = getItem(curr, i);
    if (!item) {
      return nullptr;
    }
    if (auto* iff = item->dynCast<If>()) {
      return iff;
    }
    return nullptr;
  }